

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spongerng.c
# Opt level: O1

decaf_error_t
decaf_spongerng_init_from_file(decaf_keccak_prng_s *prng,char *file,size_t len,int deterministic)

{
  int __fd;
  size_t len_00;
  size_t __nbytes;
  decaf_error_t dVar1;
  uint8_t nope;
  uint8_t buffer [128];
  uint8_t local_b9;
  uint8_t local_b8 [136];
  
  decaf_sha3_init(prng->sponge,&DECAF_SHAKE256_params_s);
  prng->sponge[0].params[0].remaining = deterministic == 0;
  dVar1 = DECAF_FAILURE;
  if ((len != 0) && (__fd = open(file,0), dVar1 = DECAF_FAILURE, -1 < __fd)) {
    for (; len != 0; len = len - len_00) {
      __nbytes = len & 0xffffffff;
      if (0x80 < len) {
        __nbytes = 0x80;
      }
      len_00 = read(__fd,local_b8,__nbytes);
      if ((long)len_00 < 1) {
        close(__fd);
        return DECAF_FAILURE;
      }
      decaf_sha3_update(prng->sponge,local_b8,len_00);
    }
    close(__fd);
    decaf_spongerng_stir(prng,&local_b9,0);
    dVar1 = DECAF_SUCCESS;
  }
  return dVar1;
}

Assistant:

decaf_error_t decaf_spongerng_init_from_file (
    decaf_keccak_prng_t prng,
    const char *file,
    size_t len,
    int deterministic
) {
    decaf_sha3_init(prng->sponge,&DECAF_SHAKE256_params_s);
    prng->sponge->params->remaining = !deterministic; /* A bit of a hack; this param is ignored for SHAKE */
    if (!len) return DECAF_FAILURE;

#if defined _MSC_VER
    /* no /dev/urandom on windows, use rand_s instead */
    if (strcmp(file, "/dev/urandom") == 0) {
        unsigned int r;
        uint8_t buffer[sizeof(unsigned int)];
        errno_t err;
        while (len) {
            int i;
            err = rand_s(&r);
            if (err != 0) {
                return DECAF_FAILURE;
            }
            for (i = 0; i < sizeof(unsigned int); i++) {
                buffer[i] = (uint8_t)(r & 0xff);
                r >>= 8;
            }
            size_t consumed = (len > sizeof(buffer)) ? sizeof(buffer) : len;
            decaf_sha3_update(prng->sponge, buffer, consumed);
            len -= consumed;
	}
    } else {
#endif /* _MSC_VER */

    int fd = open(file, O_RDONLY);
    if (fd < 0) return DECAF_FAILURE;
    
    uint8_t buffer[128];
    while (len) {
        ssize_t red = read(fd, buffer, (len > sizeof(buffer)) ? sizeof(buffer) : (unsigned int)len);
        if (red <= 0) {
            close(fd);
            return DECAF_FAILURE;
        }
        decaf_sha3_update(prng->sponge,buffer,red);
        len -= red;
    };
    close(fd);
#if defined _MSC_VER
    }
#endif /* _MSC_VER */
    const uint8_t nope;
    decaf_spongerng_stir(prng,&nope,0);
    
    return DECAF_SUCCESS;
}